

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O0

Point __thiscall Path::current_point(Path *this)

{
  bool bVar1;
  const_reference this_00;
  const_reference pvVar2;
  Subpath *subpath;
  Path *this_local;
  
  bVar1 = std::vector<Subpath,_std::allocator<Subpath>_>::empty(&this->subpaths);
  if (bVar1) {
    Point::Point((Point *)&this_local,0.0,0.0);
  }
  else {
    this_00 = std::vector<Subpath,_std::allocator<Subpath>_>::back(&this->subpaths);
    if ((this_00->closed & 1U) == 0) {
      pvVar2 = std::vector<Point,_std::allocator<Point>_>::back(&this_00->points);
      this_local = *(Path **)pvVar2;
    }
    else {
      pvVar2 = std::vector<Point,_std::allocator<Point>_>::front(&this_00->points);
      this_local = *(Path **)pvVar2;
    }
  }
  return (Point)this_local;
}

Assistant:

Point current_point() const {
		if (subpaths.empty()) {
			return Point(0.f, 0.f);
		}
		const Subpath& subpath = subpaths.back();
		if (subpath.closed) {
			return subpath.points.front();
		}
		else {
			return subpath.points.back();
		}
	}